

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

uint qpdf_oh_get_uint_value_as_uint(qpdf_data qpdf,qpdf_oh oh)

{
  uint uVar1;
  anon_class_1_0_00000001 local_61;
  function<unsigned_int_(QPDFObjectHandle_&)> local_60;
  uint local_3c;
  function<unsigned_int_()> local_38;
  qpdf_oh local_14;
  qpdf_data p_Stack_10;
  qpdf_oh oh_local;
  qpdf_data qpdf_local;
  
  local_3c = 0;
  local_14 = oh;
  p_Stack_10 = qpdf;
  return_T<unsigned_int>(&local_38,&local_3c);
  std::function<unsigned_int(QPDFObjectHandle&)>::function<qpdf_oh_get_uint_value_as_uint::__0,void>
            ((function<unsigned_int(QPDFObjectHandle&)> *)&local_60,&local_61);
  uVar1 = do_with_oh<unsigned_int>(qpdf,oh,&local_38,&local_60);
  std::function<unsigned_int_(QPDFObjectHandle_&)>::~function(&local_60);
  std::function<unsigned_int_()>::~function(&local_38);
  return uVar1;
}

Assistant:

unsigned int
qpdf_oh_get_uint_value_as_uint(qpdf_data qpdf, qpdf_oh oh)
{
    return do_with_oh<unsigned int>(qpdf, oh, return_T<unsigned int>(0U), [](QPDFObjectHandle& o) {
        QTC::TC("qpdf", "qpdf-c called qpdf_oh_get_uint_value_as_uint");
        return o.getUIntValueAsUInt();
    });
}